

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O2

void __thiscall ProjectWriter::writeEnergy(ProjectWriter *this)

{
  undefined1 *puVar1;
  pointer ppLVar2;
  Link *pLVar3;
  long lVar4;
  int iVar5;
  ostream *poVar6;
  pointer ppLVar7;
  Pump *pump;
  string local_50;
  
  puVar1 = &this->field_0x18;
  std::operator<<((ostream *)puVar1,"\n[ENERGY]\n");
  Options::energyOptionsToStr_abi_cxx11_(&local_50,&this->network->options,this->network);
  std::operator<<((ostream *)puVar1,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ppLVar2 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar7 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppLVar7 != ppLVar2; ppLVar7 = ppLVar7 + 1) {
    pLVar3 = *ppLVar7;
    iVar5 = (*(pLVar3->super_Element)._vptr_Element[2])(pLVar3);
    if (iVar5 == 1) {
      lVar4 = *(long *)&this->field_0x18;
      *(uint *)(&this->field_0x30 + *(long *)(lVar4 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar4 + -0x18)) & 0xffffff4f | 0x20;
      *(uint *)(&this->field_0x30 + *(long *)(lVar4 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar4 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&this->field_0x20 + *(long *)(lVar4 + -0x18)) = 4;
      if (pLVar3[2].super_Element._vptr_Element != (_func_int **)0x0) {
        poVar6 = std::operator<<((ostream *)puVar1,"PUMP  ");
        poVar6 = std::operator<<(poVar6,(string *)&(pLVar3->super_Element).name);
        poVar6 = std::operator<<(poVar6,"  ");
        std::operator<<(poVar6,"EFFIC  ");
        poVar6 = std::operator<<((ostream *)puVar1,
                                 (string *)(pLVar3[2].super_Element._vptr_Element + 1));
        std::operator<<(poVar6,"\n");
      }
      if (0.0 < (double)pLVar3[2].super_Element.name._M_string_length) {
        poVar6 = std::operator<<((ostream *)puVar1,"PUMP  ");
        poVar6 = std::operator<<(poVar6,(string *)&(pLVar3->super_Element).name);
        poVar6 = std::operator<<(poVar6,"  ");
        std::operator<<(poVar6,"PRICE  ");
        poVar6 = std::ostream::_M_insert<double>
                           ((double)pLVar3[2].super_Element.name._M_string_length);
        std::operator<<(poVar6,"\n");
      }
      if (pLVar3[2].super_Element.name._M_dataplus._M_p != (pointer)0x0) {
        poVar6 = std::operator<<((ostream *)puVar1,"PUMP  ");
        poVar6 = std::operator<<(poVar6,(string *)&(pLVar3->super_Element).name);
        poVar6 = std::operator<<(poVar6,"  ");
        std::operator<<(poVar6,"PATTERN  ");
        poVar6 = std::operator<<((ostream *)puVar1,
                                 (string *)(pLVar3[2].super_Element.name._M_dataplus._M_p + 8));
        std::operator<<(poVar6,"\n");
      }
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeEnergy()
{
    fout << "\n[ENERGY]\n";
    fout << network->options.energyOptionsToStr(network);
    for (Link* link : network->links)
    {
    	if ( link->type() == Link::PUMP )
    	{
    	    Pump* pump = static_cast<Pump*>(link);
    	    fout << left << fixed << setprecision(4);
    	    if ( pump->efficCurve )
    	    {
    	        fout << "PUMP  " << link->name << "  " << "EFFIC  ";
    	        fout << pump->efficCurve->name << "\n";
    	    }

    	    if ( pump->costPerKwh > 0.0 )
    	    {
    	        fout << "PUMP  " << link->name << "  " << "PRICE  " << pump->costPerKwh << "\n";
    	    }

    	    if ( pump->costPattern )
    	    {
    	        fout << "PUMP  " << link->name << "  " << "PATTERN  ";
    	        fout << pump->costPattern->name << "\n";
    	    }
    	}
    }
}